

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_compiled.cpp
# Opt level: O0

void __thiscall
randomx::CompiledVm<randomx::LargePageAllocator,_false,_true>::CompiledVm
          (CompiledVm<randomx::LargePageAllocator,_false,_true> *this)

{
  VmBase<randomx::LargePageAllocator,_false> *in_RDI;
  JitCompilerX86 *in_stack_00000030;
  
  VmBase<randomx::LargePageAllocator,_false>::VmBase(in_RDI);
  (in_RDI->super_randomx_vm)._vptr_randomx_vm = (_func_int **)&PTR__CompiledVm_00164c48;
  JitCompilerX86::JitCompilerX86(in_stack_00000030);
  return;
}

Assistant:

CompiledVm<Allocator, softAes, secureJit>::CompiledVm() {
		if (!secureJit) {
			compiler.enableAll(); //make JIT buffer both writable and executable
		}
	}